

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_builder.hpp
# Opt level: O1

vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
* __thiscall
pico_tree::internal::
build_rkd_tree<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,784ul>
::operator()(vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
             *__return_storage_ptr__,void *this,
            space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
            space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule,size_t forest_size)

{
  node *pnVar1;
  space_type *psVar2;
  pointer paVar3;
  long lVar4;
  size_t extraout_RDX;
  pointer pfVar5;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  size_t dim;
  size_t sVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  kd_tree_data_type t;
  point<float,_784UL> r;
  size_t local_4aa0;
  pointer local_4a98;
  pointer pfStack_4a90;
  pointer local_4a88;
  space_type *local_4a80;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *local_4a78;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *local_4a70;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *local_4a68;
  size_t local_4a60;
  kd_tree_data_type local_4a58;
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> local_3190;
  point<float,_784UL> local_c70;
  
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a80 = space.space_;
  local_4a78 = stop_condition;
  local_4a70 = start_bounds;
  local_4a68 = rule;
  std::
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  ::reserve(__return_storage_ptr__,forest_size);
  if (forest_size != 0) {
    sVar6 = 0;
    dim = extraout_RDX;
    do {
      random_normal<float,784ul>(&local_c70,(internal *)0x310,dim);
      psVar2 = local_4a80;
      matrix_space<float,_784UL>::matrix_space
                ((matrix_space<float,_784UL> *)&local_4aa0,
                 ((long)(local_4a80->_M_data->
                        super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_4a80->_M_data->
                        super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 6) * 0x7d6343eb1a1f58d1,0x310)
      ;
      paVar3 = (psVar2->_M_data->
               super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(psVar2->_M_data->
                    super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar3;
      if (lVar4 != 0) {
        lVar4 = (lVar4 >> 6) * 0x7d6343eb1a1f58d1;
        lVar7 = 0;
        pfVar5 = local_4a98;
        do {
          fVar9 = 0.0;
          lVar8 = 0;
          do {
            fVar9 = fVar9 + local_c70.elems_._M_elems[lVar8] * paVar3->_M_elems[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x310);
          lVar8 = 0;
          do {
            pfVar5[lVar8] =
                 local_c70.elems_._M_elems[lVar8] * fVar9 * -2.0 + paVar3->_M_elems[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x310);
          lVar7 = lVar7 + 1;
          paVar3 = paVar3 + 1;
          pfVar5 = pfVar5 + 0x310;
        } while (lVar7 != lVar4 + (ulong)(lVar4 == 0));
      }
      local_4a60 = sVar6;
      build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,784ul>
      ::operator()(&local_4a58,&local_3190,(space_type *)&local_4aa0,local_4a78,local_4a70,
                   local_4a68);
      memcpy(&local_3190,&local_c70,0xc40);
      local_3190.space.storage_.size = local_4aa0;
      local_3190.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = local_4a98;
      local_3190.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfStack_4a90;
      local_3190.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_4a88;
      local_4a88 = (pointer)0x0;
      local_4a98 = (pointer)0x0;
      pfStack_4a90 = (pointer)0x0;
      local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      memcpy(&local_3190.tree.root_box,&local_4a58.root_box,0x1880);
      local_3190.tree.allocator.resource_._vptr_list_pool_resource =
           (_func_int **)&PTR__list_pool_resource_00111d80;
      local_3190.tree.allocator.resource_.head_ = local_4a58.allocator.resource_.head_;
      local_4a58.allocator.resource_.head_ = (node *)0x0;
      local_3190.tree.allocator.object_index_ = local_4a58.allocator.object_index_;
      local_3190.tree.allocator.chunk_ = local_4a58.allocator.chunk_;
      local_3190.tree.root_node = local_4a58.root_node;
      ::std::
      vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>>
      ::
      emplace_back<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
                ((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>>
                  *)__return_storage_ptr__,&local_3190);
      local_3190.tree.allocator.resource_._vptr_list_pool_resource =
           (_func_int **)&PTR__list_pool_resource_00111d80;
      dim = extraout_RDX_00;
      while (local_3190.tree.allocator.resource_.head_ != (node *)0x0) {
        pnVar1 = (local_3190.tree.allocator.resource_.head_)->prev;
        operator_delete(local_3190.tree.allocator.resource_.head_,0x2808);
        dim = extraout_RDX_01;
        local_3190.tree.allocator.resource_.head_ = pnVar1;
      }
      if (local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3190.tree.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        dim = extraout_RDX_02;
      }
      if (local_3190.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3190.space.storage_.elems.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3190.space.storage_.elems.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3190.space.storage_.elems.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        dim = extraout_RDX_03;
      }
      local_4a58.allocator.resource_._vptr_list_pool_resource =
           (_func_int **)&PTR__list_pool_resource_00111d80;
      while (local_4a58.allocator.resource_.head_ != (node *)0x0) {
        pnVar1 = (local_4a58.allocator.resource_.head_)->prev;
        operator_delete(local_4a58.allocator.resource_.head_,0x2808);
        dim = extraout_RDX_04;
        local_4a58.allocator.resource_.head_ = pnVar1;
      }
      if (local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a58.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        dim = extraout_RDX_05;
      }
      sVar6 = local_4a60;
      if (local_4a98 != (pointer)0x0) {
        operator_delete(local_4a98,(long)local_4a88 - (long)local_4a98);
        dim = extraout_RDX_06;
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != forest_size);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<rkd_tree_data_type> operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const& rule,
      size_t forest_size) {
    assert(forest_size > 0);

    using space_wrapper_type = typename rkd_tree_data_type::space_wrapper_type;
    using build_kd_tree_type = build_kd_tree<kd_tree_data_type, Dim_>;

    std::vector<rkd_tree_data_type> trees;
    trees.reserve(forest_size);
    for (std::size_t i = 0; i < forest_size; ++i) {
      auto r = rkd_tree_data_type::random_rotation(space);
      auto s = rkd_tree_data_type::rotate_space(r, space);
      auto t = build_kd_tree_type()(
          space_wrapper_type(s), stop_condition, start_bounds, rule);
      trees.push_back({std::move(r), std::move(s), std::move(t)});
    }
    return trees;
  }